

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::DiscreteAverageOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  long *plVar1;
  AvgState<duckdb::hugeint_t> *state;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  AvgState<duckdb::hugeint_t> **states_00;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      plVar1 = *(long **)(input + 0x20);
      states_00 = *(AvgState<duckdb::hugeint_t> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::AvgState<duckdb::hugeint_t>,long,duckdb::DiscreteAverageOperation>
                (plVar1,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    plVar1 = *(long **)(input + 0x20);
    state = (AvgState<duckdb::hugeint_t> *)**(undefined8 **)(states + 0x20);
    state->count = state->count + count;
    AddToHugeint::AddConstant<duckdb::AvgState<duckdb::hugeint_t>,long>(state,*plVar1,count);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_b0 == 0) {
    if (count != 0) {
      lVar2 = *local_c0;
      lVar3 = *local_78;
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if (lVar2 != 0) {
          iVar7 = (idx_t)*(uint *)(lVar2 + iVar6 * 4);
        }
        iVar8 = iVar6;
        if (lVar3 != 0) {
          iVar8 = (idx_t)*(uint *)(lVar3 + iVar6 * 4);
        }
        plVar1 = *(long **)(local_70 + iVar8 * 8);
        *plVar1 = *plVar1 + 1;
        uVar4 = *(ulong *)(local_b8 + iVar7 * 8);
        lVar5 = plVar1[1];
        plVar1[1] = lVar5 + uVar4;
        if (-1 < (long)uVar4 != uVar4 <= lVar5 + uVar4) {
          plVar1[2] = plVar1[2] + ((long)uVar4 >> 0x3f | 1U);
        }
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else if (count != 0) {
    lVar2 = *local_c0;
    lVar3 = *local_78;
    iVar6 = 0;
    do {
      iVar7 = iVar6;
      if (lVar2 != 0) {
        iVar7 = (idx_t)*(uint *)(lVar2 + iVar6 * 4);
      }
      iVar8 = iVar6;
      if (lVar3 != 0) {
        iVar8 = (idx_t)*(uint *)(lVar3 + iVar6 * 4);
      }
      if ((*(ulong *)(local_b0 + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0) {
        plVar1 = *(long **)(local_70 + iVar8 * 8);
        *plVar1 = *plVar1 + 1;
        uVar4 = *(ulong *)(local_b8 + iVar7 * 8);
        lVar5 = plVar1[1];
        plVar1[1] = lVar5 + uVar4;
        if (-1 < (long)uVar4 != uVar4 <= lVar5 + uVar4) {
          plVar1[2] = plVar1[2] + ((long)uVar4 >> 0x3f | 1U);
        }
      }
      iVar6 = iVar6 + 1;
    } while (count != iVar6);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}